

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

XML_Convert_Result unknown_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char cVar1;
  uint uVar2;
  int c;
  char *buf_00;
  byte *pbVar3;
  char buf [4];
  char local_3c [4];
  char *local_38;
  
  pbVar3 = (byte *)*fromP;
  local_38 = toLim;
  do {
    if (pbVar3 == (byte *)fromLim) {
      return XML_CONVERT_COMPLETED;
    }
    buf_00 = local_3c;
    cVar1 = *(char *)((long)enc[7].literalScanners + (ulong)*pbVar3 * 4 + 0x40);
    uVar2 = (uint)cVar1;
    if (cVar1 == '\0') {
      c = (*enc[3].charRefNumber)((ENCODING *)enc[3].predefinedEntityName,(char *)pbVar3);
      uVar2 = XmlUtf8Encode(c,buf_00);
      if ((long)local_38 - (long)*toP < (long)(ulong)uVar2) {
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      pbVar3 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3
                                 ));
    }
    else {
      if ((long)local_38 - (long)*toP < (long)(int)uVar2) {
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      buf_00 = (char *)((long)enc[7].literalScanners + (ulong)*pbVar3 * 4 + 0x41);
      pbVar3 = pbVar3 + 1;
    }
    *fromP = (char *)pbVar3;
    memcpy(*toP,buf_00,(long)(int)uVar2);
    *toP = *toP + (int)uVar2;
    pbVar3 = (byte *)*fromP;
  } while( true );
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf8(const ENCODING *enc,
               const char **fromP, const char *fromLim,
               char **toP, const char *toLim)
{
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  char buf[XML_UTF8_ENCODE_MAX];
  for (;;) {
    const char *utf8;
    int n;
    if (*fromP == fromLim)
      return XML_CONVERT_COMPLETED;
    utf8 = uenc->utf8[(unsigned char)**fromP];
    n = *utf8++;
    if (n == 0) {
      int c = uenc->convert(uenc->userData, *fromP);
      n = XmlUtf8Encode(c, buf);
      if (n > toLim - *toP)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      utf8 = buf;
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    }
    else {
      if (n > toLim - *toP)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      (*fromP)++;
    }
    memcpy(*toP, utf8, n);
    *toP += n;
  }
}